

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_full_path.cpp
# Opt level: O0

void test_trace(void)

{
  double __x;
  allocator<char> local_51;
  string local_50;
  undefined1 local_30 [47];
  Printer<__filename,___prefix> __tracer;
  
  SpyingSerial::clear(&Serial);
  ArduinoTrace::Printer<test_trace()::__filename,test_trace()::__prefix>::
  Printer<SpyingSerial,char[18]>
            ((Printer<test_trace()::__filename,test_trace()::__prefix> *)(local_30 + 0x27),&Serial,
             (char (*) [18])"void test_trace()");
  SpyingSerial::log_abi_cxx11_((SpyingSerial *)local_30,__x);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             ".+test_full_path.cpp:\\d+: void test_trace\\(\\)\r\nflush\\(\\)\r\n",&local_51);
  ASSERT_RE((string *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void test_trace() {
  Serial.clear();
  TRACE();
  ASSERT_RE(Serial.log(),
            ".+test_full_path.cpp:\\d+: void test_trace\\(\\)\r\n"
            "flush\\(\\)\r\n");
}